

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTAudioEngine_CreateStreamingWaveBank
                   (FACTAudioEngine *pEngine,FACTStreamingParameters *pParms,
                   FACTWaveBank **ppWaveBank)

{
  uint32_t uVar1;
  FACTGetOverlappedResultCallback pOverlap;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  pOverlap = pEngine->pGetOverlappedResult;
  if (pOverlap == FACT_INTERNAL_DefaultGetOverlappedResult &&
      pEngine->pReadFile == FACT_INTERNAL_DefaultReadFile) {
    uVar1 = 0;
    pOverlap = FACT_INTERNAL_DefaultGetOverlappedResult;
  }
  else {
    uVar1 = (uint)pParms->packetSize << 0xb;
  }
  uVar1 = FACT_INTERNAL_ParseWaveBank
                    (pEngine,pParms->file,pParms->offset,uVar1,pEngine->pReadFile,pOverlap,1,
                     ppWaveBank);
  FAudio_PlatformUnlockMutex(pEngine->apiLock);
  return uVar1;
}

Assistant:

uint32_t FACTAudioEngine_CreateStreamingWaveBank(
	FACTAudioEngine *pEngine,
	const FACTStreamingParameters *pParms,
	FACTWaveBank **ppWaveBank
) {
	uint32_t retval, packetSize;
	FAudio_PlatformLockMutex(pEngine->apiLock);
	if (	pEngine->pReadFile == FACT_INTERNAL_DefaultReadFile &&
		pEngine->pGetOverlappedResult == FACT_INTERNAL_DefaultGetOverlappedResult	)
	{
		/* Our I/O doesn't care about packets, set to 0 as an optimization */
		packetSize = 0;
	}
	else
	{
		packetSize = pParms->packetSize * 2048;
	}
	retval = FACT_INTERNAL_ParseWaveBank(
		pEngine,
		pParms->file,
		pParms->offset,
		packetSize,
		pEngine->pReadFile,
		pEngine->pGetOverlappedResult,
		1,
		ppWaveBank
	);
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return retval;
}